

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O1

void cdef_filter_16_1_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  short *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  short sVar36;
  short sVar38;
  undefined1 auVar37 [16];
  undefined1 auVar40 [16];
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  undefined1 in_XMM7 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar73;
  short sVar74;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 in_XMM8 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  short sVar84;
  undefined1 in_XMM9 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  short local_28;
  short sStack_26;
  ushort uVar39;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar90;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  
  bVar31 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar26 = (long)cdef_directions_padded[(long)dir + 2][0];
  lVar30 = (long)cdef_directions_padded[(long)dir + 2][1];
  if (block_width == 8) {
    uVar27 = pri_damping;
    if (pri_strength != 0) {
      iVar9 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      uVar27 = pri_damping - iVar9;
      if (pri_damping < iVar9) {
        uVar27 = 0;
      }
    }
    if (0 < block_height) {
      auVar32 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
      auVar35._0_4_ = auVar32._0_4_;
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      auVar32 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar31][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar31][0]),0);
      auVar34._0_4_ = auVar32._0_4_;
      auVar34._4_4_ = auVar34._0_4_;
      auVar34._8_4_ = auVar34._0_4_;
      auVar34._12_4_ = auVar34._0_4_;
      auVar37 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar31][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar31][1]),0);
      uVar28 = 0;
      do {
        uVar10 = *in;
        uVar11 = in[1];
        uVar12 = in[2];
        uVar13 = in[3];
        uVar14 = in[4];
        uVar15 = in[5];
        uVar16 = in[6];
        uVar17 = in[7];
        uVar18 = in[0x90];
        uVar19 = in[0x91];
        uVar20 = in[0x92];
        uVar21 = in[0x93];
        uVar22 = in[0x94];
        uVar23 = in[0x95];
        uVar24 = in[0x96];
        uVar25 = in[0x97];
        auVar75 = lddqu(in_XMM8,*(undefined1 (*) [16])(in + lVar26));
        auVar64 = lddqu(in_XMM7,*(undefined1 (*) [16])(in + lVar26 + 0x90));
        auVar91 = lddqu(in_XMM10,*(undefined1 (*) [16])(in + -lVar26));
        auVar85 = lddqu(in_XMM9,*(undefined1 (*) [16])(in + (0x90 - lVar26)));
        auVar76._0_2_ = auVar75._0_2_ - uVar10;
        auVar76._2_2_ = auVar75._2_2_ - uVar11;
        auVar76._4_2_ = auVar75._4_2_ - uVar12;
        auVar76._6_2_ = auVar75._6_2_ - uVar13;
        auVar76._8_2_ = auVar75._8_2_ - uVar14;
        auVar76._10_2_ = auVar75._10_2_ - uVar15;
        auVar76._12_2_ = auVar75._12_2_ - uVar16;
        auVar76._14_2_ = auVar75._14_2_ - uVar17;
        auVar65._0_2_ = auVar64._0_2_ - uVar18;
        auVar65._2_2_ = auVar64._2_2_ - uVar19;
        auVar65._4_2_ = auVar64._4_2_ - uVar20;
        auVar65._6_2_ = auVar64._6_2_ - uVar21;
        auVar65._8_2_ = auVar64._8_2_ - uVar22;
        auVar65._10_2_ = auVar64._10_2_ - uVar23;
        auVar65._12_2_ = auVar64._12_2_ - uVar24;
        auVar65._14_2_ = auVar64._14_2_ - uVar25;
        auVar127 = pabsw(in_XMM13,auVar76);
        auVar75 = psraw(auVar76,0xf);
        auVar133 = pabsw(in_XMM14,auVar65);
        uVar33 = (ulong)uVar27;
        uVar39 = auVar127._0_2_;
        auVar107._0_2_ = uVar39 >> uVar33;
        uVar41 = auVar127._2_2_;
        auVar107._2_2_ = uVar41 >> uVar33;
        uVar42 = auVar127._4_2_;
        auVar107._4_2_ = uVar42 >> uVar33;
        uVar43 = auVar127._6_2_;
        auVar107._6_2_ = uVar43 >> uVar33;
        uVar44 = auVar127._8_2_;
        auVar107._8_2_ = uVar44 >> uVar33;
        uVar45 = auVar127._10_2_;
        auVar107._10_2_ = uVar45 >> uVar33;
        uVar46 = auVar127._12_2_;
        uVar47 = auVar127._14_2_;
        auVar107._12_2_ = uVar46 >> uVar33;
        auVar107._14_2_ = uVar47 >> uVar33;
        auVar64 = psraw(auVar65,0xf);
        uVar90 = auVar133._0_2_;
        auVar137._0_2_ = uVar90 >> uVar33;
        uVar100 = auVar133._2_2_;
        auVar137._2_2_ = uVar100 >> uVar33;
        uVar101 = auVar133._4_2_;
        auVar137._4_2_ = uVar101 >> uVar33;
        uVar102 = auVar133._6_2_;
        auVar137._6_2_ = uVar102 >> uVar33;
        uVar103 = auVar133._8_2_;
        auVar137._8_2_ = uVar103 >> uVar33;
        uVar104 = auVar133._10_2_;
        auVar137._10_2_ = uVar104 >> uVar33;
        uVar105 = auVar133._12_2_;
        uVar106 = auVar133._14_2_;
        auVar137._12_2_ = uVar105 >> uVar33;
        auVar137._14_2_ = uVar106 >> uVar33;
        auVar118 = psubusw(auVar35,auVar107);
        auVar108 = psubusw(auVar35,auVar137);
        sVar54 = auVar118._0_2_;
        sVar55 = auVar118._2_2_;
        sVar56 = auVar118._4_2_;
        sVar57 = auVar118._6_2_;
        sVar58 = auVar118._8_2_;
        sVar59 = auVar118._10_2_;
        sVar60 = auVar118._12_2_;
        sVar61 = auVar118._14_2_;
        sVar36 = auVar108._0_2_;
        sVar38 = auVar108._2_2_;
        sVar48 = auVar108._4_2_;
        sVar49 = auVar108._6_2_;
        sVar50 = auVar108._8_2_;
        sVar51 = auVar108._10_2_;
        sVar52 = auVar108._12_2_;
        sVar53 = auVar108._14_2_;
        auVar119._0_2_ =
             (((short)uVar39 < sVar54) * uVar39 | (ushort)((short)uVar39 >= sVar54) * sVar54) +
             auVar75._0_2_;
        auVar119._2_2_ =
             (((short)uVar41 < sVar55) * uVar41 | (ushort)((short)uVar41 >= sVar55) * sVar55) +
             auVar75._2_2_;
        auVar119._4_2_ =
             (((short)uVar42 < sVar56) * uVar42 | (ushort)((short)uVar42 >= sVar56) * sVar56) +
             auVar75._4_2_;
        auVar119._6_2_ =
             (((short)uVar43 < sVar57) * uVar43 | (ushort)((short)uVar43 >= sVar57) * sVar57) +
             auVar75._6_2_;
        auVar119._8_2_ =
             (((short)uVar44 < sVar58) * uVar44 | (ushort)((short)uVar44 >= sVar58) * sVar58) +
             auVar75._8_2_;
        auVar119._10_2_ =
             (((short)uVar45 < sVar59) * uVar45 | (ushort)((short)uVar45 >= sVar59) * sVar59) +
             auVar75._10_2_;
        auVar119._12_2_ =
             (((short)uVar46 < sVar60) * uVar46 | (ushort)((short)uVar46 >= sVar60) * sVar60) +
             auVar75._12_2_;
        auVar119._14_2_ =
             (((short)uVar47 < sVar61) * uVar47 | (ushort)((short)uVar47 >= sVar61) * sVar61) +
             auVar75._14_2_;
        auVar109._0_2_ =
             (((short)uVar90 < sVar36) * uVar90 | (ushort)((short)uVar90 >= sVar36) * sVar36) +
             auVar64._0_2_;
        auVar109._2_2_ =
             (((short)uVar100 < sVar38) * uVar100 | (ushort)((short)uVar100 >= sVar38) * sVar38) +
             auVar64._2_2_;
        auVar109._4_2_ =
             (((short)uVar101 < sVar48) * uVar101 | (ushort)((short)uVar101 >= sVar48) * sVar48) +
             auVar64._4_2_;
        auVar109._6_2_ =
             (((short)uVar102 < sVar49) * uVar102 | (ushort)((short)uVar102 >= sVar49) * sVar49) +
             auVar64._6_2_;
        auVar109._8_2_ =
             (((short)uVar103 < sVar50) * uVar103 | (ushort)((short)uVar103 >= sVar50) * sVar50) +
             auVar64._8_2_;
        auVar109._10_2_ =
             (((short)uVar104 < sVar51) * uVar104 | (ushort)((short)uVar104 >= sVar51) * sVar51) +
             auVar64._10_2_;
        auVar109._12_2_ =
             (((short)uVar105 < sVar52) * uVar105 | (ushort)((short)uVar105 >= sVar52) * sVar52) +
             auVar64._12_2_;
        auVar109._14_2_ =
             (((short)uVar106 < sVar53) * uVar106 | (ushort)((short)uVar106 >= sVar53) * sVar53) +
             auVar64._14_2_;
        auVar119 = auVar119 ^ auVar75;
        auVar109 = auVar109 ^ auVar64;
        auVar92._0_2_ = auVar91._0_2_ - uVar10;
        auVar92._2_2_ = auVar91._2_2_ - uVar11;
        auVar92._4_2_ = auVar91._4_2_ - uVar12;
        auVar92._6_2_ = auVar91._6_2_ - uVar13;
        auVar92._8_2_ = auVar91._8_2_ - uVar14;
        auVar92._10_2_ = auVar91._10_2_ - uVar15;
        auVar92._12_2_ = auVar91._12_2_ - uVar16;
        auVar92._14_2_ = auVar91._14_2_ - uVar17;
        auVar86._0_2_ = auVar85._0_2_ - uVar18;
        auVar86._2_2_ = auVar85._2_2_ - uVar19;
        auVar86._4_2_ = auVar85._4_2_ - uVar20;
        auVar86._6_2_ = auVar85._6_2_ - uVar21;
        auVar86._8_2_ = auVar85._8_2_ - uVar22;
        auVar86._10_2_ = auVar85._10_2_ - uVar23;
        auVar86._12_2_ = auVar85._12_2_ - uVar24;
        auVar86._14_2_ = auVar85._14_2_ - uVar25;
        auVar64 = pabsw(auVar127,auVar92);
        auVar91 = psraw(auVar92,0xf);
        auVar75 = pabsw(auVar133,auVar86);
        auVar85 = psraw(auVar86,0xf);
        uVar33 = (ulong)uVar27;
        uVar39 = auVar64._0_2_;
        auVar66._0_2_ = uVar39 >> uVar33;
        uVar41 = auVar64._2_2_;
        auVar66._2_2_ = uVar41 >> uVar33;
        uVar42 = auVar64._4_2_;
        auVar66._4_2_ = uVar42 >> uVar33;
        uVar43 = auVar64._6_2_;
        auVar66._6_2_ = uVar43 >> uVar33;
        uVar44 = auVar64._8_2_;
        auVar66._8_2_ = uVar44 >> uVar33;
        uVar45 = auVar64._10_2_;
        auVar66._10_2_ = uVar45 >> uVar33;
        uVar46 = auVar64._12_2_;
        uVar47 = auVar64._14_2_;
        auVar66._12_2_ = uVar46 >> uVar33;
        auVar66._14_2_ = uVar47 >> uVar33;
        uVar90 = auVar75._0_2_;
        auVar138._0_2_ = uVar90 >> uVar33;
        uVar100 = auVar75._2_2_;
        auVar138._2_2_ = uVar100 >> uVar33;
        uVar101 = auVar75._4_2_;
        auVar138._4_2_ = uVar101 >> uVar33;
        uVar102 = auVar75._6_2_;
        auVar138._6_2_ = uVar102 >> uVar33;
        uVar103 = auVar75._8_2_;
        auVar138._8_2_ = uVar103 >> uVar33;
        uVar104 = auVar75._10_2_;
        auVar138._10_2_ = uVar104 >> uVar33;
        uVar105 = auVar75._12_2_;
        uVar106 = auVar75._14_2_;
        auVar138._12_2_ = uVar105 >> uVar33;
        auVar138._14_2_ = uVar106 >> uVar33;
        auVar75 = psubusw(auVar35,auVar66);
        auVar64 = psubusw(auVar35,auVar138);
        sVar54 = auVar75._0_2_;
        sVar55 = auVar75._2_2_;
        sVar56 = auVar75._4_2_;
        sVar57 = auVar75._6_2_;
        sVar58 = auVar75._8_2_;
        sVar59 = auVar75._10_2_;
        sVar60 = auVar75._12_2_;
        sVar61 = auVar75._14_2_;
        sVar36 = auVar64._0_2_;
        sVar38 = auVar64._2_2_;
        sVar48 = auVar64._4_2_;
        sVar49 = auVar64._6_2_;
        sVar50 = auVar64._8_2_;
        sVar51 = auVar64._10_2_;
        sVar52 = auVar64._12_2_;
        sVar53 = auVar64._14_2_;
        auVar77._0_2_ =
             (((short)uVar39 < sVar54) * uVar39 | (ushort)((short)uVar39 >= sVar54) * sVar54) +
             auVar91._0_2_;
        auVar77._2_2_ =
             (((short)uVar41 < sVar55) * uVar41 | (ushort)((short)uVar41 >= sVar55) * sVar55) +
             auVar91._2_2_;
        auVar77._4_2_ =
             (((short)uVar42 < sVar56) * uVar42 | (ushort)((short)uVar42 >= sVar56) * sVar56) +
             auVar91._4_2_;
        auVar77._6_2_ =
             (((short)uVar43 < sVar57) * uVar43 | (ushort)((short)uVar43 >= sVar57) * sVar57) +
             auVar91._6_2_;
        auVar77._8_2_ =
             (((short)uVar44 < sVar58) * uVar44 | (ushort)((short)uVar44 >= sVar58) * sVar58) +
             auVar91._8_2_;
        auVar77._10_2_ =
             (((short)uVar45 < sVar59) * uVar45 | (ushort)((short)uVar45 >= sVar59) * sVar59) +
             auVar91._10_2_;
        auVar77._12_2_ =
             (((short)uVar46 < sVar60) * uVar46 | (ushort)((short)uVar46 >= sVar60) * sVar60) +
             auVar91._12_2_;
        auVar77._14_2_ =
             (((short)uVar47 < sVar61) * uVar47 | (ushort)((short)uVar47 >= sVar61) * sVar61) +
             auVar91._14_2_;
        auVar67._0_2_ =
             (((short)uVar90 < sVar36) * uVar90 | (ushort)((short)uVar90 >= sVar36) * sVar36) +
             auVar85._0_2_;
        auVar67._2_2_ =
             (((short)uVar100 < sVar38) * uVar100 | (ushort)((short)uVar100 >= sVar38) * sVar38) +
             auVar85._2_2_;
        auVar67._4_2_ =
             (((short)uVar101 < sVar48) * uVar101 | (ushort)((short)uVar101 >= sVar48) * sVar48) +
             auVar85._4_2_;
        auVar67._6_2_ =
             (((short)uVar102 < sVar49) * uVar102 | (ushort)((short)uVar102 >= sVar49) * sVar49) +
             auVar85._6_2_;
        auVar67._8_2_ =
             (((short)uVar103 < sVar50) * uVar103 | (ushort)((short)uVar103 >= sVar50) * sVar50) +
             auVar85._8_2_;
        auVar67._10_2_ =
             (((short)uVar104 < sVar51) * uVar104 | (ushort)((short)uVar104 >= sVar51) * sVar51) +
             auVar85._10_2_;
        auVar67._12_2_ =
             (((short)uVar105 < sVar52) * uVar105 | (ushort)((short)uVar105 >= sVar52) * sVar52) +
             auVar85._12_2_;
        auVar67._14_2_ =
             (((short)uVar106 < sVar53) * uVar106 | (ushort)((short)uVar106 >= sVar53) * sVar53) +
             auVar85._14_2_;
        auVar77 = auVar77 ^ auVar91;
        auVar67 = auVar67 ^ auVar85;
        auVar108 = lddqu(auVar109,*(undefined1 (*) [16])(in + lVar30));
        auVar118 = lddqu(auVar119,*(undefined1 (*) [16])(in + lVar30 + 0x90));
        auVar75 = lddqu(auVar91,*(undefined1 (*) [16])(in + -lVar30));
        auVar64 = lddqu(auVar85,*(undefined1 (*) [16])(in + (0x90 - lVar30)));
        auVar110._0_2_ = auVar108._0_2_ - uVar10;
        auVar110._2_2_ = auVar108._2_2_ - uVar11;
        auVar110._4_2_ = auVar108._4_2_ - uVar12;
        auVar110._6_2_ = auVar108._6_2_ - uVar13;
        auVar110._8_2_ = auVar108._8_2_ - uVar14;
        auVar110._10_2_ = auVar108._10_2_ - uVar15;
        auVar110._12_2_ = auVar108._12_2_ - uVar16;
        auVar110._14_2_ = auVar108._14_2_ - uVar17;
        auVar120._0_2_ = auVar118._0_2_ - uVar18;
        auVar120._2_2_ = auVar118._2_2_ - uVar19;
        auVar120._4_2_ = auVar118._4_2_ - uVar20;
        auVar120._6_2_ = auVar118._6_2_ - uVar21;
        auVar120._8_2_ = auVar118._8_2_ - uVar22;
        auVar120._10_2_ = auVar118._10_2_ - uVar23;
        auVar120._12_2_ = auVar118._12_2_ - uVar24;
        auVar120._14_2_ = auVar118._14_2_ - uVar25;
        auVar108 = pabsw(auVar138,auVar110);
        auVar85 = psraw(auVar110,0xf);
        auVar34 = pabsw(auVar34,auVar120);
        auVar91 = psraw(auVar120,0xf);
        uVar90 = auVar108._0_2_;
        auVar128._0_2_ = uVar90 >> uVar33;
        uVar100 = auVar108._2_2_;
        auVar128._2_2_ = uVar100 >> uVar33;
        uVar101 = auVar108._4_2_;
        auVar128._4_2_ = uVar101 >> uVar33;
        uVar102 = auVar108._6_2_;
        auVar128._6_2_ = uVar102 >> uVar33;
        uVar103 = auVar108._8_2_;
        auVar128._8_2_ = uVar103 >> uVar33;
        uVar104 = auVar108._10_2_;
        auVar128._10_2_ = uVar104 >> uVar33;
        uVar105 = auVar108._12_2_;
        uVar106 = auVar108._14_2_;
        auVar128._12_2_ = uVar105 >> uVar33;
        auVar128._14_2_ = uVar106 >> uVar33;
        uVar39 = auVar34._0_2_;
        auVar40._0_2_ = uVar39 >> uVar33;
        uVar41 = auVar34._2_2_;
        auVar40._2_2_ = uVar41 >> uVar33;
        uVar42 = auVar34._4_2_;
        auVar40._4_2_ = uVar42 >> uVar33;
        uVar43 = auVar34._6_2_;
        auVar40._6_2_ = uVar43 >> uVar33;
        uVar44 = auVar34._8_2_;
        auVar40._8_2_ = uVar44 >> uVar33;
        uVar45 = auVar34._10_2_;
        auVar40._10_2_ = uVar45 >> uVar33;
        uVar46 = auVar34._12_2_;
        uVar47 = auVar34._14_2_;
        auVar40._12_2_ = uVar46 >> uVar33;
        auVar40._14_2_ = uVar47 >> uVar33;
        auVar118 = psubusw(auVar35,auVar128);
        auVar108 = psubusw(auVar35,auVar40);
        sVar54 = auVar118._0_2_;
        sVar55 = auVar118._2_2_;
        sVar56 = auVar118._4_2_;
        sVar57 = auVar118._6_2_;
        sVar58 = auVar118._8_2_;
        sVar59 = auVar118._10_2_;
        sVar60 = auVar118._12_2_;
        sVar61 = auVar118._14_2_;
        sVar36 = auVar108._0_2_;
        sVar38 = auVar108._2_2_;
        sVar48 = auVar108._4_2_;
        sVar49 = auVar108._6_2_;
        sVar50 = auVar108._8_2_;
        sVar51 = auVar108._10_2_;
        sVar52 = auVar108._12_2_;
        sVar53 = auVar108._14_2_;
        auVar134._0_2_ =
             (((short)uVar90 < sVar54) * uVar90 | (ushort)((short)uVar90 >= sVar54) * sVar54) +
             auVar85._0_2_;
        auVar134._2_2_ =
             (((short)uVar100 < sVar55) * uVar100 | (ushort)((short)uVar100 >= sVar55) * sVar55) +
             auVar85._2_2_;
        auVar134._4_2_ =
             (((short)uVar101 < sVar56) * uVar101 | (ushort)((short)uVar101 >= sVar56) * sVar56) +
             auVar85._4_2_;
        auVar134._6_2_ =
             (((short)uVar102 < sVar57) * uVar102 | (ushort)((short)uVar102 >= sVar57) * sVar57) +
             auVar85._6_2_;
        auVar134._8_2_ =
             (((short)uVar103 < sVar58) * uVar103 | (ushort)((short)uVar103 >= sVar58) * sVar58) +
             auVar85._8_2_;
        auVar134._10_2_ =
             (((short)uVar104 < sVar59) * uVar104 | (ushort)((short)uVar104 >= sVar59) * sVar59) +
             auVar85._10_2_;
        auVar134._12_2_ =
             (((short)uVar105 < sVar60) * uVar105 | (ushort)((short)uVar105 >= sVar60) * sVar60) +
             auVar85._12_2_;
        auVar134._14_2_ =
             (((short)uVar106 < sVar61) * uVar106 | (ushort)((short)uVar106 >= sVar61) * sVar61) +
             auVar85._14_2_;
        auVar129._0_2_ =
             (((short)uVar39 < sVar36) * uVar39 | (ushort)((short)uVar39 >= sVar36) * sVar36) +
             auVar91._0_2_;
        auVar129._2_2_ =
             (((short)uVar41 < sVar38) * uVar41 | (ushort)((short)uVar41 >= sVar38) * sVar38) +
             auVar91._2_2_;
        auVar129._4_2_ =
             (((short)uVar42 < sVar48) * uVar42 | (ushort)((short)uVar42 >= sVar48) * sVar48) +
             auVar91._4_2_;
        auVar129._6_2_ =
             (((short)uVar43 < sVar49) * uVar43 | (ushort)((short)uVar43 >= sVar49) * sVar49) +
             auVar91._6_2_;
        auVar129._8_2_ =
             (((short)uVar44 < sVar50) * uVar44 | (ushort)((short)uVar44 >= sVar50) * sVar50) +
             auVar91._8_2_;
        auVar129._10_2_ =
             (((short)uVar45 < sVar51) * uVar45 | (ushort)((short)uVar45 >= sVar51) * sVar51) +
             auVar91._10_2_;
        auVar129._12_2_ =
             (((short)uVar46 < sVar52) * uVar46 | (ushort)((short)uVar46 >= sVar52) * sVar52) +
             auVar91._12_2_;
        auVar129._14_2_ =
             (((short)uVar47 < sVar53) * uVar47 | (ushort)((short)uVar47 >= sVar53) * sVar53) +
             auVar91._14_2_;
        in_XMM14 = auVar134 ^ auVar85;
        in_XMM13 = auVar129 ^ auVar91;
        auVar93._0_2_ = auVar75._0_2_ - uVar10;
        auVar93._2_2_ = auVar75._2_2_ - uVar11;
        auVar93._4_2_ = auVar75._4_2_ - uVar12;
        auVar93._6_2_ = auVar75._6_2_ - uVar13;
        auVar93._8_2_ = auVar75._8_2_ - uVar14;
        auVar93._10_2_ = auVar75._10_2_ - uVar15;
        auVar93._12_2_ = auVar75._12_2_ - uVar16;
        auVar93._14_2_ = auVar75._14_2_ - uVar17;
        auVar87._0_2_ = auVar64._0_2_ - uVar18;
        auVar87._2_2_ = auVar64._2_2_ - uVar19;
        auVar87._4_2_ = auVar64._4_2_ - uVar20;
        auVar87._6_2_ = auVar64._6_2_ - uVar21;
        auVar87._8_2_ = auVar64._8_2_ - uVar22;
        auVar87._10_2_ = auVar64._10_2_ - uVar23;
        auVar87._12_2_ = auVar64._12_2_ - uVar24;
        auVar87._14_2_ = auVar64._14_2_ - uVar25;
        auVar34 = pabsw(auVar34,auVar93);
        auVar64 = pabsw(auVar40,auVar87);
        uVar33 = (ulong)uVar27;
        uVar39 = auVar34._0_2_;
        auVar121._0_2_ = uVar39 >> uVar33;
        uVar41 = auVar34._2_2_;
        auVar121._2_2_ = uVar41 >> uVar33;
        uVar42 = auVar34._4_2_;
        auVar121._4_2_ = uVar42 >> uVar33;
        uVar43 = auVar34._6_2_;
        auVar121._6_2_ = uVar43 >> uVar33;
        uVar44 = auVar34._8_2_;
        auVar121._8_2_ = uVar44 >> uVar33;
        uVar45 = auVar34._10_2_;
        auVar121._10_2_ = uVar45 >> uVar33;
        uVar46 = auVar34._12_2_;
        uVar47 = auVar34._14_2_;
        auVar121._12_2_ = uVar46 >> uVar33;
        auVar121._14_2_ = uVar47 >> uVar33;
        uVar90 = auVar64._0_2_;
        auVar139._0_2_ = uVar90 >> uVar33;
        uVar100 = auVar64._2_2_;
        auVar139._2_2_ = uVar100 >> uVar33;
        uVar101 = auVar64._4_2_;
        auVar139._4_2_ = uVar101 >> uVar33;
        uVar102 = auVar64._6_2_;
        auVar139._6_2_ = uVar102 >> uVar33;
        uVar103 = auVar64._8_2_;
        auVar139._8_2_ = uVar103 >> uVar33;
        uVar104 = auVar64._10_2_;
        auVar139._10_2_ = uVar104 >> uVar33;
        uVar105 = auVar64._12_2_;
        uVar106 = auVar64._14_2_;
        auVar139._12_2_ = uVar105 >> uVar33;
        auVar139._14_2_ = uVar106 >> uVar33;
        auVar34 = psubusw(auVar35,auVar121);
        auVar75 = psubusw(auVar35,auVar139);
        sVar36 = auVar34._0_2_;
        sVar38 = auVar34._2_2_;
        sVar48 = auVar34._4_2_;
        sVar49 = auVar34._6_2_;
        sVar50 = auVar34._8_2_;
        sVar51 = auVar34._10_2_;
        sVar52 = auVar34._12_2_;
        sVar53 = auVar34._14_2_;
        sVar54 = auVar75._0_2_;
        sVar55 = auVar75._2_2_;
        sVar56 = auVar75._4_2_;
        sVar57 = auVar75._6_2_;
        sVar58 = auVar75._8_2_;
        sVar59 = auVar75._10_2_;
        sVar60 = auVar75._12_2_;
        sVar61 = auVar75._14_2_;
        in_XMM10 = psraw(auVar93,0xf);
        auVar111._0_2_ =
             (((short)uVar39 < sVar36) * uVar39 | (ushort)((short)uVar39 >= sVar36) * sVar36) +
             in_XMM10._0_2_;
        auVar111._2_2_ =
             (((short)uVar41 < sVar38) * uVar41 | (ushort)((short)uVar41 >= sVar38) * sVar38) +
             in_XMM10._2_2_;
        auVar111._4_2_ =
             (((short)uVar42 < sVar48) * uVar42 | (ushort)((short)uVar42 >= sVar48) * sVar48) +
             in_XMM10._4_2_;
        auVar111._6_2_ =
             (((short)uVar43 < sVar49) * uVar43 | (ushort)((short)uVar43 >= sVar49) * sVar49) +
             in_XMM10._6_2_;
        auVar111._8_2_ =
             (((short)uVar44 < sVar50) * uVar44 | (ushort)((short)uVar44 >= sVar50) * sVar50) +
             in_XMM10._8_2_;
        auVar111._10_2_ =
             (((short)uVar45 < sVar51) * uVar45 | (ushort)((short)uVar45 >= sVar51) * sVar51) +
             in_XMM10._10_2_;
        auVar111._12_2_ =
             (((short)uVar46 < sVar52) * uVar46 | (ushort)((short)uVar46 >= sVar52) * sVar52) +
             in_XMM10._12_2_;
        auVar111._14_2_ =
             (((short)uVar47 < sVar53) * uVar47 | (ushort)((short)uVar47 >= sVar53) * sVar53) +
             in_XMM10._14_2_;
        auVar111 = auVar111 ^ in_XMM10;
        in_XMM9 = psraw(auVar87,0xf);
        auVar122._0_2_ =
             (((short)uVar90 < sVar54) * uVar90 | (ushort)((short)uVar90 >= sVar54) * sVar54) +
             in_XMM9._0_2_;
        auVar122._2_2_ =
             (((short)uVar100 < sVar55) * uVar100 | (ushort)((short)uVar100 >= sVar55) * sVar55) +
             in_XMM9._2_2_;
        auVar122._4_2_ =
             (((short)uVar101 < sVar56) * uVar101 | (ushort)((short)uVar101 >= sVar56) * sVar56) +
             in_XMM9._4_2_;
        auVar122._6_2_ =
             (((short)uVar102 < sVar57) * uVar102 | (ushort)((short)uVar102 >= sVar57) * sVar57) +
             in_XMM9._6_2_;
        auVar122._8_2_ =
             (((short)uVar103 < sVar58) * uVar103 | (ushort)((short)uVar103 >= sVar58) * sVar58) +
             in_XMM9._8_2_;
        auVar122._10_2_ =
             (((short)uVar104 < sVar59) * uVar104 | (ushort)((short)uVar104 >= sVar59) * sVar59) +
             in_XMM9._10_2_;
        auVar122._12_2_ =
             (((short)uVar105 < sVar60) * uVar105 | (ushort)((short)uVar105 >= sVar60) * sVar60) +
             in_XMM9._12_2_;
        auVar122._14_2_ =
             (((short)uVar106 < sVar61) * uVar106 | (ushort)((short)uVar106 >= sVar61) * sVar61) +
             in_XMM9._14_2_;
        auVar122 = auVar122 ^ in_XMM9;
        local_28 = auVar32._0_2_;
        sStack_26 = auVar32._2_2_;
        in_XMM8._0_2_ = (auVar77._0_2_ + auVar119._0_2_) * local_28;
        in_XMM8._2_2_ = (auVar77._2_2_ + auVar119._2_2_) * sStack_26;
        in_XMM8._4_2_ = (auVar77._4_2_ + auVar119._4_2_) * local_28;
        in_XMM8._6_2_ = (auVar77._6_2_ + auVar119._6_2_) * sStack_26;
        in_XMM8._8_2_ = (auVar77._8_2_ + auVar119._8_2_) * local_28;
        in_XMM8._10_2_ = (auVar77._10_2_ + auVar119._10_2_) * sStack_26;
        in_XMM8._12_2_ = (auVar77._12_2_ + auVar119._12_2_) * local_28;
        in_XMM8._14_2_ = (auVar77._14_2_ + auVar119._14_2_) * sStack_26;
        sVar36 = auVar37._0_2_;
        sVar38 = auVar37._2_2_;
        auVar112._0_2_ = (auVar111._0_2_ + in_XMM14._0_2_) * sVar36 + in_XMM8._0_2_;
        auVar112._2_2_ = (auVar111._2_2_ + in_XMM14._2_2_) * sVar38 + in_XMM8._2_2_;
        auVar112._4_2_ = (auVar111._4_2_ + in_XMM14._4_2_) * sVar36 + in_XMM8._4_2_;
        auVar112._6_2_ = (auVar111._6_2_ + in_XMM14._6_2_) * sVar38 + in_XMM8._6_2_;
        auVar112._8_2_ = (auVar111._8_2_ + in_XMM14._8_2_) * sVar36 + in_XMM8._8_2_;
        auVar112._10_2_ = (auVar111._10_2_ + in_XMM14._10_2_) * sVar38 + in_XMM8._10_2_;
        auVar112._12_2_ = (auVar111._12_2_ + in_XMM14._12_2_) * sVar36 + in_XMM8._12_2_;
        auVar112._14_2_ = (auVar111._14_2_ + in_XMM14._14_2_) * sVar38 + in_XMM8._14_2_;
        in_XMM7._0_2_ = (auVar67._0_2_ + auVar109._0_2_) * local_28;
        in_XMM7._2_2_ = (auVar67._2_2_ + auVar109._2_2_) * sStack_26;
        in_XMM7._4_2_ = (auVar67._4_2_ + auVar109._4_2_) * local_28;
        in_XMM7._6_2_ = (auVar67._6_2_ + auVar109._6_2_) * sStack_26;
        in_XMM7._8_2_ = (auVar67._8_2_ + auVar109._8_2_) * local_28;
        in_XMM7._10_2_ = (auVar67._10_2_ + auVar109._10_2_) * sStack_26;
        in_XMM7._12_2_ = (auVar67._12_2_ + auVar109._12_2_) * local_28;
        in_XMM7._14_2_ = (auVar67._14_2_ + auVar109._14_2_) * sStack_26;
        auVar123._0_2_ = (auVar122._0_2_ + in_XMM13._0_2_) * sVar36 + in_XMM7._0_2_;
        auVar123._2_2_ = (auVar122._2_2_ + in_XMM13._2_2_) * sVar38 + in_XMM7._2_2_;
        auVar123._4_2_ = (auVar122._4_2_ + in_XMM13._4_2_) * sVar36 + in_XMM7._4_2_;
        auVar123._6_2_ = (auVar122._6_2_ + in_XMM13._6_2_) * sVar38 + in_XMM7._6_2_;
        auVar123._8_2_ = (auVar122._8_2_ + in_XMM13._8_2_) * sVar36 + in_XMM7._8_2_;
        auVar123._10_2_ = (auVar122._10_2_ + in_XMM13._10_2_) * sVar38 + in_XMM7._10_2_;
        auVar123._12_2_ = (auVar122._12_2_ + in_XMM13._12_2_) * sVar36 + in_XMM7._12_2_;
        auVar123._14_2_ = (auVar122._14_2_ + in_XMM13._14_2_) * sVar38 + in_XMM7._14_2_;
        auVar34 = psraw(auVar112,0xf);
        auVar64 = pmovsxbw(auVar64,0x808080808080808);
        auVar113._0_2_ = auVar112._0_2_ + auVar64._0_2_ + auVar34._0_2_;
        auVar113._2_2_ = auVar112._2_2_ + auVar64._2_2_ + auVar34._2_2_;
        auVar113._4_2_ = auVar112._4_2_ + auVar64._4_2_ + auVar34._4_2_;
        auVar113._6_2_ = auVar112._6_2_ + auVar64._6_2_ + auVar34._6_2_;
        auVar113._8_2_ = auVar112._8_2_ + auVar64._8_2_ + auVar34._8_2_;
        auVar113._10_2_ = auVar112._10_2_ + auVar64._10_2_ + auVar34._10_2_;
        auVar113._12_2_ = auVar112._12_2_ + auVar64._12_2_ + auVar34._12_2_;
        auVar113._14_2_ = auVar112._14_2_ + auVar64._14_2_ + auVar34._14_2_;
        auVar34 = psraw(auVar123,0xf);
        auVar124._0_2_ = auVar123._0_2_ + auVar64._0_2_ + auVar34._0_2_;
        auVar124._2_2_ = auVar123._2_2_ + auVar64._2_2_ + auVar34._2_2_;
        auVar124._4_2_ = auVar123._4_2_ + auVar64._4_2_ + auVar34._4_2_;
        auVar124._6_2_ = auVar123._6_2_ + auVar64._6_2_ + auVar34._6_2_;
        auVar124._8_2_ = auVar123._8_2_ + auVar64._8_2_ + auVar34._8_2_;
        auVar124._10_2_ = auVar123._10_2_ + auVar64._10_2_ + auVar34._10_2_;
        auVar124._12_2_ = auVar123._12_2_ + auVar64._12_2_ + auVar34._12_2_;
        auVar124._14_2_ = auVar123._14_2_ + auVar64._14_2_ + auVar34._14_2_;
        auVar64 = psraw(auVar113,4);
        auVar75 = psraw(auVar124,4);
        *(uint16_t *)dest = auVar64._0_2_ + uVar10;
        *(uint16_t *)((long)dest + 2) = auVar64._2_2_ + uVar11;
        *(uint16_t *)((long)dest + 4) = auVar64._4_2_ + uVar12;
        *(uint16_t *)((long)dest + 6) = auVar64._6_2_ + uVar13;
        *(uint16_t *)((long)dest + 8) = auVar64._8_2_ + uVar14;
        *(uint16_t *)((long)dest + 10) = auVar64._10_2_ + uVar15;
        *(uint16_t *)((long)dest + 0xc) = auVar64._12_2_ + uVar16;
        *(uint16_t *)((long)dest + 0xe) = auVar64._14_2_ + uVar17;
        psVar1 = (short *)((long)dest + (long)dstride * 2);
        *psVar1 = auVar75._0_2_ + uVar18;
        psVar1[1] = auVar75._2_2_ + uVar19;
        psVar1[2] = auVar75._4_2_ + uVar20;
        psVar1[3] = auVar75._6_2_ + uVar21;
        psVar1[4] = auVar75._8_2_ + uVar22;
        psVar1[5] = auVar75._10_2_ + uVar23;
        psVar1[6] = auVar75._12_2_ + uVar24;
        psVar1[7] = auVar75._14_2_ + uVar25;
        uVar28 = uVar28 + 2;
        in = in + 0x120;
        dest = (void *)((long)dest + (long)dstride * 2 * 2);
      } while (uVar28 < (uint)block_height);
    }
  }
  else {
    uVar27 = pri_damping;
    if (pri_strength != 0) {
      iVar9 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      uVar27 = pri_damping - iVar9;
      if (pri_damping < iVar9) {
        uVar27 = 0;
      }
    }
    if (0 < block_height) {
      auVar32 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
      auVar32._4_4_ = auVar32._0_4_;
      auVar32._8_4_ = auVar32._0_4_;
      auVar32._12_4_ = auVar32._0_4_;
      auVar35 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar31][0]),
                        ZEXT416((uint)cdef_pri_taps[bVar31][0]),0);
      auVar37._0_4_ = auVar35._0_4_;
      auVar37._4_4_ = auVar37._0_4_;
      auVar37._8_4_ = auVar37._0_4_;
      auVar37._12_4_ = auVar37._0_4_;
      auVar34 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar31][1]),
                        ZEXT416((uint)cdef_pri_taps[bVar31][1]),0);
      lVar29 = (long)dstride;
      uVar28 = 0;
      do {
        uVar2 = *(undefined8 *)in;
        uVar3 = *(undefined8 *)(in + 0x90);
        uVar4 = *(undefined8 *)(in + 0x120);
        uVar5 = *(undefined8 *)(in + 0x1b0);
        uVar6 = *(undefined8 *)(in + lVar26);
        uVar7 = *(undefined8 *)(in + lVar26 + 0x90);
        uVar33 = *(ulong *)(in + lVar26 + 0x120);
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar33;
        uVar8 = *(undefined8 *)(in + lVar26 + 0x1b0);
        sVar56 = (short)uVar3;
        auVar75._0_2_ = (short)uVar7 - sVar56;
        sVar57 = (short)((ulong)uVar3 >> 0x10);
        auVar75._2_2_ = (short)((ulong)uVar7 >> 0x10) - sVar57;
        sVar58 = (short)((ulong)uVar3 >> 0x20);
        auVar75._4_2_ = (short)((ulong)uVar7 >> 0x20) - sVar58;
        sVar59 = (short)((ulong)uVar3 >> 0x30);
        auVar75._6_2_ = (short)((ulong)uVar7 >> 0x30) - sVar59;
        sVar60 = (short)uVar2;
        auVar75._8_2_ = (short)uVar6 - sVar60;
        sVar61 = (short)((ulong)uVar2 >> 0x10);
        auVar75._10_2_ = (short)((ulong)uVar6 >> 0x10) - sVar61;
        sVar62 = (short)((ulong)uVar2 >> 0x20);
        auVar75._12_2_ = (short)((ulong)uVar6 >> 0x20) - sVar62;
        sVar63 = (short)((ulong)uVar2 >> 0x30);
        auVar75._14_2_ = (short)((ulong)uVar6 >> 0x30) - sVar63;
        sVar48 = (short)uVar5;
        auVar114._0_2_ = (short)uVar8 - sVar48;
        sVar49 = (short)((ulong)uVar5 >> 0x10);
        auVar114._2_2_ = (short)((ulong)uVar8 >> 0x10) - sVar49;
        sVar50 = (short)((ulong)uVar5 >> 0x20);
        auVar114._4_2_ = (short)((ulong)uVar8 >> 0x20) - sVar50;
        sVar51 = (short)((ulong)uVar5 >> 0x30);
        auVar114._6_2_ = (short)((ulong)uVar8 >> 0x30) - sVar51;
        sVar52 = (short)uVar4;
        auVar114._8_2_ = (short)uVar33 - sVar52;
        sVar53 = (short)((ulong)uVar4 >> 0x10);
        auVar114._10_2_ = (short)(uVar33 >> 0x10) - sVar53;
        sVar54 = (short)((ulong)uVar4 >> 0x20);
        auVar114._12_2_ = (short)(uVar33 >> 0x20) - sVar54;
        sVar55 = (short)((ulong)uVar4 >> 0x30);
        auVar114._14_2_ = (short)(uVar33 >> 0x30) - sVar55;
        auVar85 = pabsw(auVar108,auVar75);
        auVar64 = psraw(auVar75,0xf);
        auVar75 = pabsw(in_XMM12,auVar114);
        auVar91 = psraw(auVar114,0xf);
        uVar33 = (ulong)uVar27;
        uVar39 = auVar85._0_2_;
        auVar127._0_2_ = uVar39 >> uVar33;
        uVar41 = auVar85._2_2_;
        auVar127._2_2_ = uVar41 >> uVar33;
        uVar42 = auVar85._4_2_;
        auVar127._4_2_ = uVar42 >> uVar33;
        uVar43 = auVar85._6_2_;
        auVar127._6_2_ = uVar43 >> uVar33;
        uVar44 = auVar85._8_2_;
        auVar127._8_2_ = uVar44 >> uVar33;
        uVar45 = auVar85._10_2_;
        auVar127._10_2_ = uVar45 >> uVar33;
        uVar46 = auVar85._12_2_;
        uVar47 = auVar85._14_2_;
        auVar127._12_2_ = uVar46 >> uVar33;
        auVar127._14_2_ = uVar47 >> uVar33;
        uVar90 = auVar75._0_2_;
        auVar130._0_2_ = uVar90 >> uVar33;
        uVar100 = auVar75._2_2_;
        auVar130._2_2_ = uVar100 >> uVar33;
        uVar101 = auVar75._4_2_;
        auVar130._4_2_ = uVar101 >> uVar33;
        uVar102 = auVar75._6_2_;
        auVar130._6_2_ = uVar102 >> uVar33;
        uVar103 = auVar75._8_2_;
        auVar130._8_2_ = uVar103 >> uVar33;
        uVar104 = auVar75._10_2_;
        auVar130._10_2_ = uVar104 >> uVar33;
        uVar105 = auVar75._12_2_;
        uVar106 = auVar75._14_2_;
        auVar130._12_2_ = uVar105 >> uVar33;
        auVar130._14_2_ = uVar106 >> uVar33;
        auVar85 = psubusw(auVar32,auVar127);
        auVar75 = psubusw(auVar32,auVar130);
        sVar74 = auVar85._0_2_;
        sVar78 = auVar85._2_2_;
        sVar79 = auVar85._4_2_;
        sVar80 = auVar85._6_2_;
        sVar81 = auVar85._8_2_;
        sVar82 = auVar85._10_2_;
        sVar83 = auVar85._12_2_;
        sVar84 = auVar85._14_2_;
        sVar36 = auVar75._0_2_;
        sVar38 = auVar75._2_2_;
        sVar68 = auVar75._4_2_;
        sVar69 = auVar75._6_2_;
        sVar70 = auVar75._8_2_;
        sVar71 = auVar75._10_2_;
        sVar72 = auVar75._12_2_;
        sVar73 = auVar75._14_2_;
        auVar94._0_2_ =
             (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
             auVar64._0_2_;
        auVar94._2_2_ =
             (((short)uVar41 < sVar78) * uVar41 | (ushort)((short)uVar41 >= sVar78) * sVar78) +
             auVar64._2_2_;
        auVar94._4_2_ =
             (((short)uVar42 < sVar79) * uVar42 | (ushort)((short)uVar42 >= sVar79) * sVar79) +
             auVar64._4_2_;
        auVar94._6_2_ =
             (((short)uVar43 < sVar80) * uVar43 | (ushort)((short)uVar43 >= sVar80) * sVar80) +
             auVar64._6_2_;
        auVar94._8_2_ =
             (((short)uVar44 < sVar81) * uVar44 | (ushort)((short)uVar44 >= sVar81) * sVar81) +
             auVar64._8_2_;
        auVar94._10_2_ =
             (((short)uVar45 < sVar82) * uVar45 | (ushort)((short)uVar45 >= sVar82) * sVar82) +
             auVar64._10_2_;
        auVar94._12_2_ =
             (((short)uVar46 < sVar83) * uVar46 | (ushort)((short)uVar46 >= sVar83) * sVar83) +
             auVar64._12_2_;
        auVar94._14_2_ =
             (((short)uVar47 < sVar84) * uVar47 | (ushort)((short)uVar47 >= sVar84) * sVar84) +
             auVar64._14_2_;
        auVar133._0_2_ =
             (((short)uVar90 < sVar36) * uVar90 | (ushort)((short)uVar90 >= sVar36) * sVar36) +
             auVar91._0_2_;
        auVar133._2_2_ =
             (((short)uVar100 < sVar38) * uVar100 | (ushort)((short)uVar100 >= sVar38) * sVar38) +
             auVar91._2_2_;
        auVar133._4_2_ =
             (((short)uVar101 < sVar68) * uVar101 | (ushort)((short)uVar101 >= sVar68) * sVar68) +
             auVar91._4_2_;
        auVar133._6_2_ =
             (((short)uVar102 < sVar69) * uVar102 | (ushort)((short)uVar102 >= sVar69) * sVar69) +
             auVar91._6_2_;
        auVar133._8_2_ =
             (((short)uVar103 < sVar70) * uVar103 | (ushort)((short)uVar103 >= sVar70) * sVar70) +
             auVar91._8_2_;
        auVar133._10_2_ =
             (((short)uVar104 < sVar71) * uVar104 | (ushort)((short)uVar104 >= sVar71) * sVar71) +
             auVar91._10_2_;
        auVar133._12_2_ =
             (((short)uVar105 < sVar72) * uVar105 | (ushort)((short)uVar105 >= sVar72) * sVar72) +
             auVar91._12_2_;
        auVar133._14_2_ =
             (((short)uVar106 < sVar73) * uVar106 | (ushort)((short)uVar106 >= sVar73) * sVar73) +
             auVar91._14_2_;
        auVar94 = auVar94 ^ auVar64;
        auVar133 = auVar133 ^ auVar91;
        uVar2 = *(undefined8 *)(in + -lVar26);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar26));
        uVar4 = *(undefined8 *)(in + (0x120 - lVar26));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar26));
        auVar115._0_2_ = (short)uVar3 - sVar56;
        auVar115._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar57;
        auVar115._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar58;
        auVar115._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar59;
        auVar115._8_2_ = (short)uVar2 - sVar60;
        auVar115._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar61;
        auVar115._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar62;
        auVar115._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar63;
        auVar125._0_2_ = (short)uVar5 - sVar48;
        auVar125._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar49;
        auVar125._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar50;
        auVar125._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar51;
        auVar125._8_2_ = (short)uVar4 - sVar52;
        auVar125._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar53;
        auVar125._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar54;
        auVar125._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar55;
        auVar131 = pabsw(auVar130,auVar115);
        auVar108 = psraw(auVar115,0xf);
        auVar135 = pabsw(in_XMM14,auVar125);
        auVar127 = psraw(auVar125,0xf);
        uVar33 = (ulong)uVar27;
        uVar39 = auVar131._0_2_;
        auVar85._0_2_ = uVar39 >> uVar33;
        uVar41 = auVar131._2_2_;
        auVar85._2_2_ = uVar41 >> uVar33;
        uVar42 = auVar131._4_2_;
        auVar85._4_2_ = uVar42 >> uVar33;
        uVar43 = auVar131._6_2_;
        auVar85._6_2_ = uVar43 >> uVar33;
        uVar44 = auVar131._8_2_;
        auVar85._8_2_ = uVar44 >> uVar33;
        uVar45 = auVar131._10_2_;
        auVar85._10_2_ = uVar45 >> uVar33;
        uVar46 = auVar131._12_2_;
        uVar47 = auVar131._14_2_;
        auVar85._12_2_ = uVar46 >> uVar33;
        auVar85._14_2_ = uVar47 >> uVar33;
        uVar90 = auVar135._0_2_;
        auVar140._0_2_ = uVar90 >> uVar33;
        uVar100 = auVar135._2_2_;
        auVar140._2_2_ = uVar100 >> uVar33;
        uVar101 = auVar135._4_2_;
        auVar140._4_2_ = uVar101 >> uVar33;
        uVar102 = auVar135._6_2_;
        auVar140._6_2_ = uVar102 >> uVar33;
        uVar103 = auVar135._8_2_;
        auVar140._8_2_ = uVar103 >> uVar33;
        uVar104 = auVar135._10_2_;
        auVar140._10_2_ = uVar104 >> uVar33;
        uVar105 = auVar135._12_2_;
        uVar106 = auVar135._14_2_;
        auVar140._12_2_ = uVar105 >> uVar33;
        auVar140._14_2_ = uVar106 >> uVar33;
        auVar75 = psubusw(auVar32,auVar85);
        auVar64 = psubusw(auVar32,auVar140);
        sVar74 = auVar75._0_2_;
        sVar78 = auVar75._2_2_;
        sVar79 = auVar75._4_2_;
        sVar80 = auVar75._6_2_;
        sVar81 = auVar75._8_2_;
        sVar82 = auVar75._10_2_;
        sVar83 = auVar75._12_2_;
        sVar84 = auVar75._14_2_;
        sVar36 = auVar64._0_2_;
        sVar38 = auVar64._2_2_;
        sVar68 = auVar64._4_2_;
        sVar69 = auVar64._6_2_;
        sVar70 = auVar64._8_2_;
        sVar71 = auVar64._10_2_;
        sVar72 = auVar64._12_2_;
        sVar73 = auVar64._14_2_;
        auVar118._0_2_ =
             (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
             auVar108._0_2_;
        auVar118._2_2_ =
             (((short)uVar41 < sVar78) * uVar41 | (ushort)((short)uVar41 >= sVar78) * sVar78) +
             auVar108._2_2_;
        auVar118._4_2_ =
             (((short)uVar42 < sVar79) * uVar42 | (ushort)((short)uVar42 >= sVar79) * sVar79) +
             auVar108._4_2_;
        auVar118._6_2_ =
             (((short)uVar43 < sVar80) * uVar43 | (ushort)((short)uVar43 >= sVar80) * sVar80) +
             auVar108._6_2_;
        auVar118._8_2_ =
             (((short)uVar44 < sVar81) * uVar44 | (ushort)((short)uVar44 >= sVar81) * sVar81) +
             auVar108._8_2_;
        auVar118._10_2_ =
             (((short)uVar45 < sVar82) * uVar45 | (ushort)((short)uVar45 >= sVar82) * sVar82) +
             auVar108._10_2_;
        auVar118._12_2_ =
             (((short)uVar46 < sVar83) * uVar46 | (ushort)((short)uVar46 >= sVar83) * sVar83) +
             auVar108._12_2_;
        auVar118._14_2_ =
             (((short)uVar47 < sVar84) * uVar47 | (ushort)((short)uVar47 >= sVar84) * sVar84) +
             auVar108._14_2_;
        auVar91._0_2_ =
             (((short)uVar90 < sVar36) * uVar90 | (ushort)((short)uVar90 >= sVar36) * sVar36) +
             auVar127._0_2_;
        auVar91._2_2_ =
             (((short)uVar100 < sVar38) * uVar100 | (ushort)((short)uVar100 >= sVar38) * sVar38) +
             auVar127._2_2_;
        auVar91._4_2_ =
             (((short)uVar101 < sVar68) * uVar101 | (ushort)((short)uVar101 >= sVar68) * sVar68) +
             auVar127._4_2_;
        auVar91._6_2_ =
             (((short)uVar102 < sVar69) * uVar102 | (ushort)((short)uVar102 >= sVar69) * sVar69) +
             auVar127._6_2_;
        auVar91._8_2_ =
             (((short)uVar103 < sVar70) * uVar103 | (ushort)((short)uVar103 >= sVar70) * sVar70) +
             auVar127._8_2_;
        auVar91._10_2_ =
             (((short)uVar104 < sVar71) * uVar104 | (ushort)((short)uVar104 >= sVar71) * sVar71) +
             auVar127._10_2_;
        auVar91._12_2_ =
             (((short)uVar105 < sVar72) * uVar105 | (ushort)((short)uVar105 >= sVar72) * sVar72) +
             auVar127._12_2_;
        auVar91._14_2_ =
             (((short)uVar106 < sVar73) * uVar106 | (ushort)((short)uVar106 >= sVar73) * sVar73) +
             auVar127._14_2_;
        auVar118 = auVar118 ^ auVar108;
        auVar91 = auVar91 ^ auVar127;
        uVar2 = *(undefined8 *)(in + lVar30);
        uVar3 = *(undefined8 *)(in + lVar30 + 0x90);
        uVar4 = *(undefined8 *)(in + lVar30 + 0x120);
        uVar5 = *(undefined8 *)(in + lVar30 + 0x1b0);
        auVar88._0_2_ = (short)uVar3 - sVar56;
        auVar88._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar57;
        auVar88._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar58;
        auVar88._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar59;
        auVar88._8_2_ = (short)uVar2 - sVar60;
        auVar88._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar61;
        auVar88._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar62;
        auVar88._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar63;
        auVar95._0_2_ = (short)uVar5 - sVar48;
        auVar95._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar49;
        auVar95._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar50;
        auVar95._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar51;
        auVar95._8_2_ = (short)uVar4 - sVar52;
        auVar95._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar53;
        auVar95._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar54;
        auVar95._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar55;
        auVar75 = pabsw(auVar131,auVar88);
        auVar64 = psraw(auVar88,0xf);
        uVar39 = auVar75._0_2_;
        auVar116._0_2_ = uVar39 >> uVar33;
        uVar41 = auVar75._2_2_;
        auVar116._2_2_ = uVar41 >> uVar33;
        uVar42 = auVar75._4_2_;
        auVar116._4_2_ = uVar42 >> uVar33;
        uVar43 = auVar75._6_2_;
        auVar116._6_2_ = uVar43 >> uVar33;
        uVar44 = auVar75._8_2_;
        auVar116._8_2_ = uVar44 >> uVar33;
        uVar45 = auVar75._10_2_;
        auVar116._10_2_ = uVar45 >> uVar33;
        uVar46 = auVar75._12_2_;
        uVar47 = auVar75._14_2_;
        auVar116._12_2_ = uVar46 >> uVar33;
        auVar116._14_2_ = uVar47 >> uVar33;
        auVar75 = pabsw(auVar135,auVar95);
        uVar90 = auVar75._0_2_;
        auVar141._0_2_ = uVar90 >> uVar33;
        uVar100 = auVar75._2_2_;
        auVar141._2_2_ = uVar100 >> uVar33;
        uVar101 = auVar75._4_2_;
        auVar141._4_2_ = uVar101 >> uVar33;
        uVar102 = auVar75._6_2_;
        auVar141._6_2_ = uVar102 >> uVar33;
        uVar103 = auVar75._8_2_;
        auVar141._8_2_ = uVar103 >> uVar33;
        uVar104 = auVar75._10_2_;
        auVar141._10_2_ = uVar104 >> uVar33;
        uVar105 = auVar75._12_2_;
        uVar106 = auVar75._14_2_;
        auVar141._12_2_ = uVar105 >> uVar33;
        auVar141._14_2_ = uVar106 >> uVar33;
        auVar75 = psraw(auVar95,0xf);
        auVar108 = psubusw(auVar32,auVar116);
        auVar85 = psubusw(auVar32,auVar141);
        sVar74 = auVar108._0_2_;
        sVar78 = auVar108._2_2_;
        sVar79 = auVar108._4_2_;
        sVar80 = auVar108._6_2_;
        sVar81 = auVar108._8_2_;
        sVar82 = auVar108._10_2_;
        sVar83 = auVar108._12_2_;
        sVar84 = auVar108._14_2_;
        sVar36 = auVar85._0_2_;
        sVar38 = auVar85._2_2_;
        sVar68 = auVar85._4_2_;
        sVar69 = auVar85._6_2_;
        sVar70 = auVar85._8_2_;
        sVar71 = auVar85._10_2_;
        sVar72 = auVar85._12_2_;
        sVar73 = auVar85._14_2_;
        auVar126._0_2_ =
             (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
             auVar64._0_2_;
        auVar126._2_2_ =
             (((short)uVar41 < sVar78) * uVar41 | (ushort)((short)uVar41 >= sVar78) * sVar78) +
             auVar64._2_2_;
        auVar126._4_2_ =
             (((short)uVar42 < sVar79) * uVar42 | (ushort)((short)uVar42 >= sVar79) * sVar79) +
             auVar64._4_2_;
        auVar126._6_2_ =
             (((short)uVar43 < sVar80) * uVar43 | (ushort)((short)uVar43 >= sVar80) * sVar80) +
             auVar64._6_2_;
        auVar126._8_2_ =
             (((short)uVar44 < sVar81) * uVar44 | (ushort)((short)uVar44 >= sVar81) * sVar81) +
             auVar64._8_2_;
        auVar126._10_2_ =
             (((short)uVar45 < sVar82) * uVar45 | (ushort)((short)uVar45 >= sVar82) * sVar82) +
             auVar64._10_2_;
        auVar126._12_2_ =
             (((short)uVar46 < sVar83) * uVar46 | (ushort)((short)uVar46 >= sVar83) * sVar83) +
             auVar64._12_2_;
        auVar126._14_2_ =
             (((short)uVar47 < sVar84) * uVar47 | (ushort)((short)uVar47 >= sVar84) * sVar84) +
             auVar64._14_2_;
        auVar117._0_2_ =
             (((short)uVar90 < sVar36) * uVar90 | (ushort)((short)uVar90 >= sVar36) * sVar36) +
             auVar75._0_2_;
        auVar117._2_2_ =
             (((short)uVar100 < sVar38) * uVar100 | (ushort)((short)uVar100 >= sVar38) * sVar38) +
             auVar75._2_2_;
        auVar117._4_2_ =
             (((short)uVar101 < sVar68) * uVar101 | (ushort)((short)uVar101 >= sVar68) * sVar68) +
             auVar75._4_2_;
        auVar117._6_2_ =
             (((short)uVar102 < sVar69) * uVar102 | (ushort)((short)uVar102 >= sVar69) * sVar69) +
             auVar75._6_2_;
        auVar117._8_2_ =
             (((short)uVar103 < sVar70) * uVar103 | (ushort)((short)uVar103 >= sVar70) * sVar70) +
             auVar75._8_2_;
        auVar117._10_2_ =
             (((short)uVar104 < sVar71) * uVar104 | (ushort)((short)uVar104 >= sVar71) * sVar71) +
             auVar75._10_2_;
        auVar117._12_2_ =
             (((short)uVar105 < sVar72) * uVar105 | (ushort)((short)uVar105 >= sVar72) * sVar72) +
             auVar75._12_2_;
        auVar117._14_2_ =
             (((short)uVar106 < sVar73) * uVar106 | (ushort)((short)uVar106 >= sVar73) * sVar73) +
             auVar75._14_2_;
        in_XMM12 = auVar126 ^ auVar64;
        auVar117 = auVar117 ^ auVar75;
        uVar2 = *(undefined8 *)(in + -lVar30);
        uVar3 = *(undefined8 *)(in + (0x90 - lVar30));
        uVar4 = *(undefined8 *)(in + (0x120 - lVar30));
        uVar5 = *(undefined8 *)(in + (0x1b0 - lVar30));
        auVar136._0_2_ = (short)uVar3 - sVar56;
        auVar136._2_2_ = (short)((ulong)uVar3 >> 0x10) - sVar57;
        auVar136._4_2_ = (short)((ulong)uVar3 >> 0x20) - sVar58;
        auVar136._6_2_ = (short)((ulong)uVar3 >> 0x30) - sVar59;
        auVar136._8_2_ = (short)uVar2 - sVar60;
        auVar136._10_2_ = (short)((ulong)uVar2 >> 0x10) - sVar61;
        auVar136._12_2_ = (short)((ulong)uVar2 >> 0x20) - sVar62;
        auVar136._14_2_ = (short)((ulong)uVar2 >> 0x30) - sVar63;
        auVar132._0_2_ = (short)uVar5 - sVar48;
        auVar132._2_2_ = (short)((ulong)uVar5 >> 0x10) - sVar49;
        auVar132._4_2_ = (short)((ulong)uVar5 >> 0x20) - sVar50;
        auVar132._6_2_ = (short)((ulong)uVar5 >> 0x30) - sVar51;
        auVar132._8_2_ = (short)uVar4 - sVar52;
        auVar132._10_2_ = (short)((ulong)uVar4 >> 0x10) - sVar53;
        auVar132._12_2_ = (short)((ulong)uVar4 >> 0x20) - sVar54;
        auVar132._14_2_ = (short)((ulong)uVar4 >> 0x30) - sVar55;
        auVar64 = pabsw(auVar141,auVar136);
        auVar37 = pabsw(auVar37,auVar132);
        uVar33 = (ulong)uVar27;
        uVar90 = auVar64._0_2_;
        auVar96._0_2_ = uVar90 >> uVar33;
        uVar100 = auVar64._2_2_;
        auVar96._2_2_ = uVar100 >> uVar33;
        uVar101 = auVar64._4_2_;
        auVar96._4_2_ = uVar101 >> uVar33;
        uVar102 = auVar64._6_2_;
        auVar96._6_2_ = uVar102 >> uVar33;
        uVar103 = auVar64._8_2_;
        auVar96._8_2_ = uVar103 >> uVar33;
        uVar104 = auVar64._10_2_;
        auVar96._10_2_ = uVar104 >> uVar33;
        uVar105 = auVar64._12_2_;
        uVar106 = auVar64._14_2_;
        auVar96._12_2_ = uVar105 >> uVar33;
        auVar96._14_2_ = uVar106 >> uVar33;
        uVar39 = auVar37._0_2_;
        auVar64._0_2_ = uVar39 >> uVar33;
        uVar41 = auVar37._2_2_;
        auVar64._2_2_ = uVar41 >> uVar33;
        uVar42 = auVar37._4_2_;
        auVar64._4_2_ = uVar42 >> uVar33;
        uVar43 = auVar37._6_2_;
        auVar64._6_2_ = uVar43 >> uVar33;
        uVar44 = auVar37._8_2_;
        auVar64._8_2_ = uVar44 >> uVar33;
        uVar45 = auVar37._10_2_;
        auVar64._10_2_ = uVar45 >> uVar33;
        uVar46 = auVar37._12_2_;
        uVar47 = auVar37._14_2_;
        auVar64._12_2_ = uVar46 >> uVar33;
        auVar64._14_2_ = uVar47 >> uVar33;
        auVar37 = psubusw(auVar32,auVar96);
        auVar75 = psubusw(auVar32,auVar64);
        sVar36 = auVar37._0_2_;
        sVar38 = auVar37._2_2_;
        sVar68 = auVar37._4_2_;
        sVar69 = auVar37._6_2_;
        sVar70 = auVar37._8_2_;
        sVar71 = auVar37._10_2_;
        sVar72 = auVar37._12_2_;
        sVar73 = auVar37._14_2_;
        sVar74 = auVar75._0_2_;
        sVar78 = auVar75._2_2_;
        sVar79 = auVar75._4_2_;
        sVar80 = auVar75._6_2_;
        sVar81 = auVar75._8_2_;
        sVar82 = auVar75._10_2_;
        sVar83 = auVar75._12_2_;
        sVar84 = auVar75._14_2_;
        in_XMM14 = psraw(auVar136,0xf);
        auVar131._0_2_ =
             (((short)uVar90 < sVar36) * uVar90 | (ushort)((short)uVar90 >= sVar36) * sVar36) +
             in_XMM14._0_2_;
        auVar131._2_2_ =
             (((short)uVar100 < sVar38) * uVar100 | (ushort)((short)uVar100 >= sVar38) * sVar38) +
             in_XMM14._2_2_;
        auVar131._4_2_ =
             (((short)uVar101 < sVar68) * uVar101 | (ushort)((short)uVar101 >= sVar68) * sVar68) +
             in_XMM14._4_2_;
        auVar131._6_2_ =
             (((short)uVar102 < sVar69) * uVar102 | (ushort)((short)uVar102 >= sVar69) * sVar69) +
             in_XMM14._6_2_;
        auVar131._8_2_ =
             (((short)uVar103 < sVar70) * uVar103 | (ushort)((short)uVar103 >= sVar70) * sVar70) +
             in_XMM14._8_2_;
        auVar131._10_2_ =
             (((short)uVar104 < sVar71) * uVar104 | (ushort)((short)uVar104 >= sVar71) * sVar71) +
             in_XMM14._10_2_;
        auVar131._12_2_ =
             (((short)uVar105 < sVar72) * uVar105 | (ushort)((short)uVar105 >= sVar72) * sVar72) +
             in_XMM14._12_2_;
        auVar131._14_2_ =
             (((short)uVar106 < sVar73) * uVar106 | (ushort)((short)uVar106 >= sVar73) * sVar73) +
             in_XMM14._14_2_;
        auVar131 = auVar131 ^ in_XMM14;
        auVar37 = psraw(auVar132,0xf);
        auVar97._0_2_ =
             (((short)uVar39 < sVar74) * uVar39 | (ushort)((short)uVar39 >= sVar74) * sVar74) +
             auVar37._0_2_;
        auVar97._2_2_ =
             (((short)uVar41 < sVar78) * uVar41 | (ushort)((short)uVar41 >= sVar78) * sVar78) +
             auVar37._2_2_;
        auVar97._4_2_ =
             (((short)uVar42 < sVar79) * uVar42 | (ushort)((short)uVar42 >= sVar79) * sVar79) +
             auVar37._4_2_;
        auVar97._6_2_ =
             (((short)uVar43 < sVar80) * uVar43 | (ushort)((short)uVar43 >= sVar80) * sVar80) +
             auVar37._6_2_;
        auVar97._8_2_ =
             (((short)uVar44 < sVar81) * uVar44 | (ushort)((short)uVar44 >= sVar81) * sVar81) +
             auVar37._8_2_;
        auVar97._10_2_ =
             (((short)uVar45 < sVar82) * uVar45 | (ushort)((short)uVar45 >= sVar82) * sVar82) +
             auVar37._10_2_;
        auVar97._12_2_ =
             (((short)uVar46 < sVar83) * uVar46 | (ushort)((short)uVar46 >= sVar83) * sVar83) +
             auVar37._12_2_;
        auVar97._14_2_ =
             (((short)uVar47 < sVar84) * uVar47 | (ushort)((short)uVar47 >= sVar84) * sVar84) +
             auVar37._14_2_;
        auVar97 = auVar97 ^ auVar37;
        local_28 = auVar35._0_2_;
        sStack_26 = auVar35._2_2_;
        sVar36 = auVar34._0_2_;
        sVar38 = auVar34._2_2_;
        auVar135._0_2_ =
             (auVar131._0_2_ + in_XMM12._0_2_) * sVar36 +
             (auVar118._0_2_ + auVar94._0_2_) * local_28;
        auVar135._2_2_ =
             (auVar131._2_2_ + in_XMM12._2_2_) * sVar38 +
             (auVar118._2_2_ + auVar94._2_2_) * sStack_26;
        auVar135._4_2_ =
             (auVar131._4_2_ + in_XMM12._4_2_) * sVar36 +
             (auVar118._4_2_ + auVar94._4_2_) * local_28;
        auVar135._6_2_ =
             (auVar131._6_2_ + in_XMM12._6_2_) * sVar38 +
             (auVar118._6_2_ + auVar94._6_2_) * sStack_26;
        auVar135._8_2_ =
             (auVar131._8_2_ + in_XMM12._8_2_) * sVar36 +
             (auVar118._8_2_ + auVar94._8_2_) * local_28;
        auVar135._10_2_ =
             (auVar131._10_2_ + in_XMM12._10_2_) * sVar38 +
             (auVar118._10_2_ + auVar94._10_2_) * sStack_26;
        auVar135._12_2_ =
             (auVar131._12_2_ + in_XMM12._12_2_) * sVar36 +
             (auVar118._12_2_ + auVar94._12_2_) * local_28;
        auVar135._14_2_ =
             (auVar131._14_2_ + in_XMM12._14_2_) * sVar38 +
             (auVar118._14_2_ + auVar94._14_2_) * sStack_26;
        auVar98._0_2_ =
             (auVar97._0_2_ + auVar117._0_2_) * sVar36 + (auVar91._0_2_ + auVar133._0_2_) * local_28
        ;
        auVar98._2_2_ =
             (auVar97._2_2_ + auVar117._2_2_) * sVar38 +
             (auVar91._2_2_ + auVar133._2_2_) * sStack_26;
        auVar98._4_2_ =
             (auVar97._4_2_ + auVar117._4_2_) * sVar36 + (auVar91._4_2_ + auVar133._4_2_) * local_28
        ;
        auVar98._6_2_ =
             (auVar97._6_2_ + auVar117._6_2_) * sVar38 +
             (auVar91._6_2_ + auVar133._6_2_) * sStack_26;
        auVar98._8_2_ =
             (auVar97._8_2_ + auVar117._8_2_) * sVar36 + (auVar91._8_2_ + auVar133._8_2_) * local_28
        ;
        auVar98._10_2_ =
             (auVar97._10_2_ + auVar117._10_2_) * sVar38 +
             (auVar91._10_2_ + auVar133._10_2_) * sStack_26;
        auVar98._12_2_ =
             (auVar97._12_2_ + auVar117._12_2_) * sVar36 +
             (auVar91._12_2_ + auVar133._12_2_) * local_28;
        auVar98._14_2_ =
             (auVar97._14_2_ + auVar117._14_2_) * sVar38 +
             (auVar91._14_2_ + auVar133._14_2_) * sStack_26;
        auVar37 = psraw(auVar135,0xf);
        auVar64 = pmovsxbw(auVar64,0x808080808080808);
        auVar89._0_2_ = auVar135._0_2_ + auVar64._0_2_ + auVar37._0_2_;
        auVar89._2_2_ = auVar135._2_2_ + auVar64._2_2_ + auVar37._2_2_;
        auVar89._4_2_ = auVar135._4_2_ + auVar64._4_2_ + auVar37._4_2_;
        auVar89._6_2_ = auVar135._6_2_ + auVar64._6_2_ + auVar37._6_2_;
        auVar89._8_2_ = auVar135._8_2_ + auVar64._8_2_ + auVar37._8_2_;
        auVar89._10_2_ = auVar135._10_2_ + auVar64._10_2_ + auVar37._10_2_;
        auVar89._12_2_ = auVar135._12_2_ + auVar64._12_2_ + auVar37._12_2_;
        auVar89._14_2_ = auVar135._14_2_ + auVar64._14_2_ + auVar37._14_2_;
        auVar75 = psraw(auVar89,4);
        auVar37 = psraw(auVar98,0xf);
        *(short *)((long)dest + 8) = auVar75._8_2_ + sVar60;
        *(short *)((long)dest + 10) = auVar75._10_2_ + sVar61;
        *(short *)((long)dest + 0xc) = auVar75._12_2_ + sVar62;
        *(short *)((long)dest + 0xe) = auVar75._14_2_ + sVar63;
        auVar99._0_2_ = auVar98._0_2_ + auVar64._0_2_ + auVar37._0_2_;
        auVar99._2_2_ = auVar98._2_2_ + auVar64._2_2_ + auVar37._2_2_;
        auVar99._4_2_ = auVar98._4_2_ + auVar64._4_2_ + auVar37._4_2_;
        auVar99._6_2_ = auVar98._6_2_ + auVar64._6_2_ + auVar37._6_2_;
        auVar99._8_2_ = auVar98._8_2_ + auVar64._8_2_ + auVar37._8_2_;
        auVar99._10_2_ = auVar98._10_2_ + auVar64._10_2_ + auVar37._10_2_;
        auVar99._12_2_ = auVar98._12_2_ + auVar64._12_2_ + auVar37._12_2_;
        auVar99._14_2_ = auVar98._14_2_ + auVar64._14_2_ + auVar37._14_2_;
        auVar64 = psraw(auVar99,4);
        psVar1 = (short *)((long)dest + lVar29 * 2);
        *psVar1 = auVar75._0_2_ + sVar56;
        psVar1[1] = auVar75._2_2_ + sVar57;
        psVar1[2] = auVar75._4_2_ + sVar58;
        psVar1[3] = auVar75._6_2_ + sVar59;
        *(short *)((long)dest + lVar29 * 4 + 8) = auVar64._8_2_ + sVar52;
        *(short *)((long)dest + lVar29 * 4 + 10) = auVar64._10_2_ + sVar53;
        *(short *)((long)dest + lVar29 * 4 + 0xc) = auVar64._12_2_ + sVar54;
        *(short *)((long)dest + lVar29 * 4 + 0xe) = auVar64._14_2_ + sVar55;
        psVar1 = (short *)((long)dest + lVar29 * 6);
        *psVar1 = auVar64._0_2_ + sVar48;
        psVar1[1] = auVar64._2_2_ + sVar49;
        psVar1[2] = auVar64._4_2_ + sVar50;
        psVar1[3] = auVar64._6_2_ + sVar51;
        uVar28 = uVar28 + 4;
        in = in + 0x240;
        dest = (void *)((long)dest + lVar29 * 8);
      } while (uVar28 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_1)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}